

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall re2::StringPiece::find(StringPiece *this,StringPiece *s,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  
  uVar4 = (ulong)this->length_;
  sVar2 = 0xffffffffffffffff;
  if ((-1 < (long)uVar4) && (pos <= uVar4)) {
    pcVar1 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->ptr_ + pos,this->ptr_ + uVar4,s->ptr_,s->ptr_ + s->length_);
    sVar3 = (long)pcVar1 - (long)this->ptr_;
    sVar2 = 0xffffffffffffffff;
    if ((long)s->length_ + sVar3 <= (ulong)(long)this->length_) {
      sVar2 = sVar3;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find(const StringPiece& s,
                                         size_type pos) const {
  if (length_ < 0 || pos > static_cast<size_type>(length_))
    return npos;

  const char* result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  const size_type xpos = result - ptr_;
  return xpos + s.length_ <= static_cast<size_type>(length_) ? xpos : npos;
}